

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O3

int tjCompress(tjhandle handle,uchar *srcBuf,int width,int pitch,int height,int pixelSize,
              uchar *jpegBuf,unsigned_long *jpegSize,int jpegSubsamp,int jpegQual,int flags)

{
  uchar *dstBuf;
  int iVar1;
  uint uVar2;
  unsigned_long local_38;
  
  iVar1 = flags;
  dstBuf = jpegBuf;
  if (((uint)flags >> 9 & 1) == 0) {
    if (pixelSize == 1) {
      uVar2 = 6;
    }
    else if (pixelSize == 4) {
      if ((flags & 0x40U) == 0) {
        uVar2 = flags & 1U | 2;
      }
      else {
        uVar2 = flags & 1U ^ 5;
      }
    }
    else if (pixelSize == 3) {
      uVar2 = flags & 1;
    }
    else {
      uVar2 = 0xffffffff;
    }
    iVar1 = tjCompress2(handle,srcBuf,width,pitch,height,uVar2,&jpegBuf,&local_38,jpegSubsamp,
                        jpegQual,flags | 0x400);
  }
  else {
    local_38 = tjBufSizeYUV2(width,4,height,jpegSubsamp);
    if (pixelSize == 1) {
      uVar2 = 6;
    }
    else if (pixelSize == 4) {
      if ((iVar1 & 0x40U) == 0) {
        uVar2 = iVar1 & 1U | 2;
      }
      else {
        uVar2 = iVar1 & 1U ^ 5;
      }
    }
    else if (pixelSize == 3) {
      uVar2 = iVar1 & 1;
    }
    else {
      uVar2 = 0xffffffff;
    }
    iVar1 = tjEncodeYUV3(handle,srcBuf,width,pitch,height,uVar2,dstBuf,4,jpegSubsamp,iVar1);
  }
  *jpegSize = local_38;
  return iVar1;
}

Assistant:

DLLEXPORT int tjCompress(tjhandle handle, unsigned char *srcBuf, int width,
                         int pitch, int height, int pixelSize,
                         unsigned char *jpegBuf, unsigned long *jpegSize,
                         int jpegSubsamp, int jpegQual, int flags)
{
  int retval = 0;
  unsigned long size;

  if (flags & TJ_YUV) {
    size = tjBufSizeYUV(width, height, jpegSubsamp);
    retval = tjEncodeYUV2(handle, srcBuf, width, pitch, height,
                          getPixelFormat(pixelSize, flags), jpegBuf,
                          jpegSubsamp, flags);
  } else {
    retval = tjCompress2(handle, srcBuf, width, pitch, height,
                         getPixelFormat(pixelSize, flags), &jpegBuf, &size,
                         jpegSubsamp, jpegQual, flags | TJFLAG_NOREALLOC);
  }
  *jpegSize = size;
  return retval;
}